

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall
CProficiencies::TrainProficiency
          (CProficiencies *this,char_data *ch,char_data *trainer,char *argument)

{
  int iVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  char *pcVar5;
  CProficiencies *pCVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  string_view fmt;
  basic_string_view<char> fmt_00;
  string_view fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  char_data *ch_local;
  int local_15a8;
  uint local_15a4;
  char_data *trainer_local;
  char *local_1598;
  CQueue *local_1590;
  string local_1588;
  string local_1568;
  string buffer;
  string local_1528;
  string local_1508;
  undefined **local_14e8;
  proficiency_msg *local_14e0;
  proficiency_msg messages;
  char *local_14a8 [2];
  char *local_1498;
  char *local_1488;
  int local_1470 [8];
  string message;
  undefined1 local_1430 [504];
  char arg1 [4608];
  
  ch_local = ch;
  trainer_local = trainer;
  if (ch == (char_data *)0x0) {
    fmt._M_str = "CProficiencies::TrainProficiency: Charater is null.";
    fmt._M_len = 0x33;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (trainer == (char_data *)0x0) {
    send_to_char("Invalid trainer",ch);
    return;
  }
  pcVar5 = one_argument(argument,arg1);
  bVar2 = str_cmp(arg1,"train");
  if (bVar2) {
    pcVar5 = "Syntax: proficiencies train <proficiency>\n\r";
  }
  else {
    uVar3 = ProfIndexLookup(pcVar5);
    lVar7 = 0;
    do {
      if (trainer_local->pIndexData->profs_taught[lVar7] == uVar3) {
        if (ch_local->pcdata == (PC_DATA *)0x0) {
          pCVar6 = &prof_none;
        }
        else {
          pCVar6 = &ch_local->pcdata->profs;
        }
        if ((uVar3 < 0x19) && (0 < pCVar6->profs[(uint)(int)(short)uVar3])) {
          pcVar5 = "You are already familiar with that proficiency.\n\r";
        }
        else {
          iVar8 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_start[(short)uVar3].cost;
          if (pCVar6->points < iVar8) {
            pcVar5 = "You don\'t have enough points to study that proficiency.\n\r";
          }
          else {
            local_1598 = prof_table.
                         super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                         _M_impl.super__Vector_impl_data._M_start[(short)uVar3].name;
            iVar1 = prof_table.
                    super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
                    super__Vector_impl_data._M_start[(short)uVar3].minlevel;
            uVar4 = ProfIndexLookup(prof_table.
                                    super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(short)uVar3].requires
                                   );
            if (uVar4 == 0xffff) {
LAB_0037768e:
              if (iVar1 <= ch_local->level) {
                local_15a8 = iVar8;
                local_15a4 = (int)(short)uVar3;
                act("You ask $N to teach you about $t.",ch_local,local_1598,trainer_local,3);
                messages.learning_msgs[0] = prof_msg_table[(short)uVar3].learning_msgs[0];
                messages.learning_msgs[1] = prof_msg_table[(short)uVar3].learning_msgs[1];
                messages.learning_msgs[4] = prof_msg_table[(short)uVar3].learning_msgs[4];
                messages.learning_msgs[2] = prof_msg_table[(short)uVar3].learning_msgs[2];
                messages.learning_msgs[3] = prof_msg_table[(short)uVar3].learning_msgs[3];
                if (messages.learning_msgs[0] == (char *)0x0) {
                  iVar8 = 2;
                }
                else {
                  local_14e0 = prof_msg_table + (short)uVar3;
                  iVar8 = 2;
                  uVar9 = 0;
                  local_14e8 = &PTR_grow_00457340;
                  local_1590 = &RS.Queue;
                  do {
                    if ((uVar9 == 4) || (messages.learning_msgs[uVar9 + 1] == (char *)0x0)) {
                      pcVar5 = get_char_color(ch_local,"yellow");
                      local_1488 = END_COLOR(ch_local);
                      local_1498 = local_1598;
                      message.field_2._M_allocated_capacity = 0;
                      message._M_dataplus._M_p = (pointer)local_14e8;
                      message._M_string_length = (size_type)local_1430;
                      message.field_2._8_8_ = 500;
                      fmt_00.size_ = 0x23;
                      fmt_00.data_ = "{}You are now proficient at {}.{}\n\r";
                      args.field_1.values_ =
                           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)
                           local_14a8;
                      args.desc_ = 0xccc;
                      local_14a8[0] = pcVar5;
                      ::fmt::v9::detail::vformat_to<char>
                                ((buffer<char> *)&message,fmt_00,args,(locale_ref)0x0);
                      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&buffer,message._M_string_length,
                                 message.field_2._M_allocated_capacity + message._M_string_length);
                      if ((undefined1 *)message._M_string_length != local_1430) {
                        operator_delete((void *)message._M_string_length,message.field_2._8_8_);
                      }
                      local_1568._M_dataplus._M_p = (pointer)&local_1568.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1568,"TrainProficiency","");
                      local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1508,"send_to_char_queue","");
                      CQueue::
                      AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
                                (local_1590,iVar8,&local_1568,&local_1508,send_to_char_queue,&buffer
                                 ,&ch_local);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
                        operator_delete(local_1508._M_dataplus._M_p,
                                        local_1508.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1568._M_dataplus._M_p != &local_1568.field_2) {
                        operator_delete(local_1568._M_dataplus._M_p,
                                        local_1568.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)buffer._M_dataplus._M_p != &buffer.field_2) {
                        operator_delete(buffer._M_dataplus._M_p,
                                        buffer.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&message,local_14e0->learning_msgs[uVar9],
                               (allocator<char> *)local_14a8);
                    local_1588._M_dataplus._M_p = (pointer)&local_1588.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1588,"TrainProficiency","");
                    local_1528._M_dataplus._M_p = (pointer)&local_1528.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1528,"act_queue","");
                    local_14a8[0] = (char *)0x0;
                    local_1470[0] = 3;
                    CQueue::
                    AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),std::__cxx11::string&,char_data*&,decltype(nullptr),char_data*&,int>
                              (local_1590,iVar8,&local_1588,&local_1528,act_queue,&message,&ch_local
                               ,local_14a8,&trainer_local,local_1470);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1528._M_dataplus._M_p != &local_1528.field_2) {
                      operator_delete(local_1528._M_dataplus._M_p,
                                      local_1528.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1588._M_dataplus._M_p != &local_1588.field_2) {
                      operator_delete(local_1588._M_dataplus._M_p,
                                      local_1588.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)message._M_dataplus._M_p != &message.field_2) {
                      operator_delete(message._M_dataplus._M_p,
                                      message.field_2._M_allocated_capacity + 1);
                    }
                    iVar8 = iVar8 + 2;
                  } while ((uVar9 < 4) &&
                          (lVar7 = uVar9 + 1, uVar9 = uVar9 + 1,
                          messages.learning_msgs[lVar7] != (char *)0x0));
                }
                if (ch_local->pcdata == (PC_DATA *)0x0) {
                  pCVar6 = &prof_none;
                }
                else {
                  pCVar6 = &ch_local->pcdata->profs;
                }
                pCVar6->points = pCVar6->points - local_15a8;
                message._M_dataplus._M_p._0_4_ = local_15a4;
                if (uVar3 < 0x19) {
                  pCVar6->profs[local_15a4] = 1;
                }
                else {
                  fmt_01._M_str = "CProficiencies::SetProf : profindex out of bounds [{}]";
                  fmt_01._M_len = 0x36;
                  CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt_01,(int *)&message);
                }
                WAIT_STATE(ch_local,iVar8);
                return;
              }
              pcVar5 = "You are not advanced enough in your guild to learn that proficiency.\n\r";
            }
            else {
              if (uVar4 < 0x19) {
                if (ch_local->pcdata == (PC_DATA *)0x0) {
                  pCVar6 = &prof_none;
                }
                else {
                  pCVar6 = &ch_local->pcdata->profs;
                }
                if (-1 < pCVar6->profs[uVar4]) goto LAB_0037768e;
              }
              pcVar5 = 
              "That proficiency requires understanding of a proficiency you do not possess.\n\r";
            }
          }
        }
        goto LAB_003776ae;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar5 = "You can\'t study that here.\n\r";
  }
LAB_003776ae:
  send_to_char(pcVar5,ch_local);
  return;
}

Assistant:

void CProficiencies::TrainProficiency(char_data* ch, char_data* trainer, char* argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::TrainProficiency: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	char arg1[MSL];
	argument = one_argument(argument, arg1);

	if (str_cmp(arg1, "train"))
	{
		send_to_char("Syntax: proficiencies train <proficiency>\n\r", ch);
		return;
	}

	auto prof = ProfIndexLookup(argument);

	int i;
	auto found = false;
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (i = 0; i < profs_taught_size; i++)
	{
		if (trainer->pIndexData->profs_taught[i] == prof)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		send_to_char("You can't study that here.\n\r", ch);
		return;
	}

	if (ch->Profs()->GetProf(prof) > 0)
	{
		send_to_char("You are already familiar with that proficiency.\n\r", ch);
		return;
	}

	auto proficiency = prof_table[prof];
	if (proficiency.cost > ch->Profs()->GetPoints())
	{
		send_to_char("You don't have enough points to study that proficiency.\n\r", ch);
		return;
	}

	auto prof_requires = ProfIndexLookup(proficiency.requires);
	if (prof_requires != -1 && ch->Profs()->GetProf(prof_requires) < 0)
	{
		send_to_char("That proficiency requires understanding of a proficiency you do not possess.\n\r", ch);
		return;
	}

	if (proficiency.minlevel > ch->level)
	{
		send_to_char("You are not advanced enough in your guild to learn that proficiency.\n\r", ch);
		return;
	}

	act("You ask $N to teach you about $t.", ch, proficiency.name, trainer, TO_CHAR);

	auto messages = prof_msg_table[prof];
	for (i = 0; messages.learning_msgs[i] != nullptr && i < 5; i++)
	{
		if (i == 4 || !messages.learning_msgs[i + 1])
		{
			auto buffer = fmt::format("{}You are now proficient at {}.{}\n\r",
				get_char_color(ch, "yellow"),
				proficiency.name,
				END_COLOR(ch));

			RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "send_to_char_queue", send_to_char_queue, buffer, ch);
		}

		auto message = std::string(prof_msg_table[prof].learning_msgs[i]);
		RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "act_queue", act_queue, message, ch, nullptr, trainer, TO_CHAR);
	}

	ch->Profs()->DeductPoints(proficiency.cost);
	ch->Profs()->SetProf(prof, 1);

	WAIT_STATE(ch, (i + 1) * 2);
}